

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O2

void __thiscall ProblemFireFighting::FillRewardModel(ProblemFireFighting *this)

{
  ulong uVar1;
  ulong uVar2;
  Index s1;
  uint uVar3;
  Index ja;
  uint uVar4;
  Index s2;
  
  uVar3 = 0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                   super_MultiAgentDecisionProcessDiscrete.
                                   super_MultiAgentDecisionProcess + 0x30))(this);
    if (uVar1 <= uVar3) break;
    uVar4 = 0;
    while( true ) {
      uVar1 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscrete.
                                     super_MultiAgentDecisionProcess + 0x70))(this);
      if (uVar1 <= uVar4) break;
      uVar1 = 0;
      while( true ) {
        uVar2 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                       super_MultiAgentDecisionProcessDiscrete.
                                       super_MultiAgentDecisionProcess + 0x30))(this);
        if (uVar2 <= uVar1) break;
        ComputeReward(this,(Index)uVar1);
        (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                               super_MultiAgentDecisionProcessDiscrete.
                               super_MultiAgentDecisionProcess + 0x188))(this,uVar3,uVar4,uVar1);
        uVar1 = (ulong)((Index)uVar1 + 1);
      }
      uVar4 = uVar4 + 1;
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void ProblemFireFighting::FillRewardModel()
{    

    for(Index s1=0; s1<GetNrStates();s1++) 
        for(Index ja=0; ja<GetNrJointActions(); ja++)
            for(Index s2=0; s2<GetNrStates();s2++) 
            {
                double r = ComputeReward(s2);
                SetReward(s1, ja, s2, r);
            }
}